

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_asm_x86.h
# Opt level: O2

void asm_comp(ASMState *as,IRIns *ir)

{
  byte bVar1;
  ushort uVar2;
  ushort uVar3;
  MCode *pMVar4;
  IRIns *pIVar5;
  IRRef ref;
  ASMState *pAVar6;
  ushort uVar7;
  Reg RVar8;
  int iVar9;
  Reg rb;
  Reg RVar10;
  MCode *pMVar11;
  ushort uVar12;
  uint uVar13;
  IRType1 origt;
  byte bVar14;
  x86Op xo;
  IRIns *pIVar15;
  ASMState *as_00;
  RegSet allow;
  ulong uVar16;
  bool bVar17;
  bool bVar18;
  uint local_54;
  int32_t imm;
  int32_t local_4c;
  ASMState *local_48;
  uint local_3c;
  IRIns *local_38;
  
  uVar2 = asm_compmap[(ir->field_1).o];
  uVar13 = (ir->field_1).t.irt & 0x1f;
  uVar12 = (ir->field_0).op2;
  local_54 = (uint)uVar2;
  if (uVar13 != 0xe) {
    uVar3 = (ir->field_0).op1;
    pIVar5 = as->ir;
    imm = 0;
    if ((-1 < (short)uVar3) ||
       ((uVar7 = uVar3, (short)uVar12 < 0 &&
        ((byte)(*(char *)((long)pIVar5 + (ulong)uVar3 * 8 + 5) + 0xbeU) < 7)))) {
      uVar7 = uVar12;
      uVar12 = uVar3;
      if ((~uVar2 & 0xc) == 0) {
        local_54 = local_54 ^ 0x53;
      }
      else {
        local_54 = (uint)uVar2;
        if ((uVar2 & 10) == 2) {
          local_54 = uVar2 ^ 0x55;
        }
      }
    }
    RVar8 = -(uint)((0x605fd9U >> uVar13 & 1) != 0) & 0x80200;
    local_48 = as;
    iVar9 = asm_isk32(as,(uint)uVar12,&imm);
    as_00 = local_48;
    if (iVar9 == 0) {
      RVar10 = ra_alloc1(as,(uint)uVar7,0xbfef);
      rb = asm_fuseloadm(as,(uint)uVar12,~(1 << (RVar10 & 0x1f)) & 0xbfef,RVar8);
      asm_guardcc(as,local_54);
      RVar8 = RVar10 | RVar8;
      xo = XO_CMP;
      as_00 = as;
      goto LAB_001392d8;
    }
    pIVar15 = pIVar5 + uVar7;
    bVar17 = imm == 0;
    bVar18 = (local_54 & 10) != 2;
    local_4c = imm;
    local_38 = pIVar15;
    if ((bVar18 && bVar17) && (pIVar15 + 1 == ir && (pIVar15->field_1).o == '!')) {
      if ((-1 < (char)(pIVar15->field_1).r) || ((pIVar15->field_1).s != '\0')) goto LAB_001391ed;
      uVar2 = (pIVar15->field_0).op2;
      iVar9 = asm_isk32(local_48,(uint)uVar2,&imm);
      if (iVar9 == 0) {
        RVar10 = ra_alloc1(as_00,(uint)uVar2,0xbfef);
        allow = ~(1 << (RVar10 & 0x1f)) & 0xbfef;
LAB_00139309:
        as_00->curins = as_00->curins - 1;
        rb = asm_fuseloadm(as_00,(uint)(pIVar15->field_0).op1,allow,RVar8);
        as_00->curins = as_00->curins + 1;
      }
      else {
        uVar16 = (ulong)(pIVar15->field_0).op1;
        allow = 0xbfef;
        RVar10 = 0x80;
        if ((6 < (byte)(*(char *)((long)pIVar5 + uVar16 * 8 + 5) + 0xbeU)) ||
           (bVar1 = *(byte *)((long)pIVar5 + uVar16 * 8 + 4), 1 < (byte)((bVar1 & 0x1f) - 0xf)))
        goto LAB_00139309;
        *(byte *)((long)pIVar5 + uVar16 * 8 + 4) = bVar1 & 0xe0 | 0x13;
        as_00->curins = as_00->curins - 1;
        rb = asm_fuseload(as_00,(uint)(pIVar15->field_0).op1,0xbfef);
        as_00->curins = as_00->curins + 1;
        *(byte *)((long)pIVar5 + uVar16 * 8 + 4) = bVar1;
        if (rb == 0x20) {
          asm_guardcc(as_00,local_54);
          pMVar4 = as_00->mcp;
          as_00->mcp = pMVar4 + -1;
          pMVar4[-1] = (MCode)imm;
          rb = 0x20;
          xo = XO_GROUP3b;
          RVar8 = 0;
          goto LAB_001392d8;
        }
        RVar10 = 0x80;
      }
      asm_guardcc(as_00,local_54);
      if ((char)RVar10 < '\0') {
        pMVar4 = as_00->mcp;
        *(int32_t *)(pMVar4 + -4) = imm;
        as_00->mcp = pMVar4 + -4;
        xo = XO_GROUP3;
      }
      else {
        RVar8 = RVar10 + RVar8;
        xo = XO_TEST;
      }
      goto LAB_001392d8;
    }
    if ((byte)((pIVar15->field_1).o + 0xbe) < 7) {
      bVar1 = (byte)(pIVar15->field_0).ot;
      bVar14 = bVar1 & 0x1f;
      if ((0xff < (uint)imm) || (bVar14 != 0x10)) {
        if (bVar14 == 0xf) {
LAB_00139158:
          if ((char)imm == imm) goto LAB_00139030;
        }
        else if (bVar14 == 0x12) {
          if (((uint)imm < 0x10000) && ((int)(short)imm == (int)(char)imm)) goto LAB_00139030;
        }
        else if (bVar14 == 0x11) goto LAB_00139158;
        goto LAB_001391ed;
      }
LAB_00139030:
      (pIVar15->field_1).t.irt = bVar1 & 0xe0 | 0x13;
      local_3c = (uint)bVar1;
      RVar10 = asm_fuseload(local_48,(uint)uVar7,0xbfef);
      pAVar6 = local_48;
      (local_38->field_1).t.irt = (uint8_t)local_3c;
      if (RVar10 == 0x20) {
        if ((bVar14 | 2) == 0x12) {
          local_54 = local_54 >> 4;
        }
        asm_guardcc(local_48,local_54);
        pMVar4 = pAVar6->mcp;
        pAVar6->mcp = pMVar4 + -1;
        pMVar4[-1] = (MCode)local_4c;
        xo = XO_ARITHiw8;
        if ((byte)(bVar14 - 0xf) < 2) {
          xo = XO_ARITHib;
        }
        RVar8 = RVar8 | 7;
        rb = 0x20;
        as_00 = pAVar6;
        goto LAB_001392d8;
      }
    }
    else {
LAB_001391ed:
      RVar10 = asm_fuseloadm(local_48,(uint)uVar7,0xbfef,RVar8);
    }
    asm_guardcc(as_00,local_54);
    if ((bVar18 && bVar17) && RVar10 != 0x20) {
      bVar17 = ((ir->field_1).t.irt & 0x1f) != 0x10;
      uVar13 = 0;
      if (!bVar17) {
        uVar13 = ~(0x1e00U >> ((byte)RVar10 & 0x1f)) & 0x200;
      }
      emit_rr(as_00,(uint)bVar17 << 0x18 | XO_TESTb,RVar8 + (uVar13 | RVar10),uVar13 | RVar10);
      if (local_38 + 1 != ir) {
        return;
      }
      as_00->flagmcp = as_00->mcp;
      return;
    }
    uVar13 = RVar10 + RVar8;
    if ((char)(MCode)local_4c == local_4c) {
      pMVar4 = as_00->mcp;
      as_00->mcp = pMVar4 + -1;
      pMVar4[-1] = (MCode)local_4c;
      xo = XO_ARITHi8;
    }
    else {
      pMVar4 = as_00->mcp;
      *(int32_t *)(pMVar4 + -4) = local_4c;
      as_00->mcp = pMVar4 + -4;
      xo = XO_ARITHi;
    }
    RVar8 = uVar13 & 0x80200 | 7;
    rb = uVar13 & 0xfff7fdff;
LAB_001392d8:
    emit_mrm(as_00,xo,RVar8,rb);
    return;
  }
  bVar17 = (uVar2 >> 0xe & 1) == 0;
  uVar13 = (uint)uVar12;
  ref = (uint)(ir->field_0).op1;
  if (bVar17) {
    uVar13 = (uint)(ir->field_0).op1;
    ref = (uint)uVar12;
  }
  uVar16 = (ulong)(uVar2 ^ 0x6050);
  if (bVar17) {
    uVar16 = (ulong)uVar2;
  }
  RVar8 = ra_alloc1(as,uVar13,0xffff0000);
  pMVar4 = as->mcp;
  asm_guardcc(as,(int)(uVar16 >> 4));
  if (((uint)uVar16 >> 0xd & 1) == 0) goto LAB_00139195;
  if (((uint)uVar16 >> 0xc & 1) == 0) {
    asm_guardcc(as,10);
    goto LAB_00139195;
  }
  if (pMVar4 == as->invmcp) {
    as->loopinv = 2;
    pMVar11 = as->mcp;
    if (as->realign != (MCode *)0x0) {
      pMVar11[-2] = 'z';
      pMVar11[-1] = '\0';
      goto LAB_0013918a;
    }
    pMVar11[-4] = '\0';
    pMVar11[-3] = '\0';
    pMVar11[-2] = '\0';
    pMVar11[-1] = '\0';
    pMVar11[-6] = '\x0f';
    pMVar11[-5] = 0x8a;
    pMVar11 = pMVar11 + -6;
  }
  else {
    pMVar11 = as->mcp;
    pMVar11[-1] = (char)pMVar4 - (char)pMVar11;
    pMVar11[-2] = 'z';
LAB_0013918a:
    pMVar11 = pMVar11 + -2;
  }
  as->mcp = pMVar11;
LAB_00139195:
  RVar10 = asm_fuseload(as,ref,~(1 << (RVar8 & 0x1f)) & 0xffff0000);
  emit_mrm(as,XO_UCOMISD,RVar8,RVar10);
  return;
}

Assistant:

static void asm_comp(ASMState *as, IRIns *ir)
{
  uint32_t cc = asm_compmap[ir->o];
  if (irt_isnum(ir->t)) {
    IRRef lref = ir->op1;
    IRRef rref = ir->op2;
    Reg left, right;
    MCLabel l_around;
    /*
    ** An extra CC_P branch is required to preserve ordered/unordered
    ** semantics for FP comparisons. This can be avoided by swapping
    ** the operands and inverting the condition (except for EQ and UNE).
    ** So always try to swap if possible.
    **
    ** Another option would be to swap operands to achieve better memory
    ** operand fusion. But it's unlikely that this outweighs the cost
    ** of the extra branches.
    */
    if (cc & VCC_S) {  /* Swap? */
      IRRef tmp = lref; lref = rref; rref = tmp;
      cc ^= (VCC_PS|(5<<4));  /* A <-> B, AE <-> BE, PS <-> none */
    }
    left = ra_alloc1(as, lref, RSET_FPR);
    l_around = emit_label(as);
    asm_guardcc(as, cc >> 4);
    if (cc & VCC_P) {  /* Extra CC_P branch required? */
      if (!(cc & VCC_U)) {
	asm_guardcc(as, CC_P);  /* Branch to exit for ordered comparisons. */
      } else if (l_around != as->invmcp) {
	emit_sjcc(as, CC_P, l_around);  /* Branch around for unordered. */
      } else {
	/* Patched to mcloop by asm_loop_fixup. */
	as->loopinv = 2;
	if (as->realign)
	  emit_sjcc(as, CC_P, as->mcp);
	else
	  emit_jcc(as, CC_P, as->mcp);
      }
    }
    right = asm_fuseload(as, rref, rset_exclude(RSET_FPR, left));
    emit_mrm(as, XO_UCOMISD, left, right);
  } else {
    IRRef lref = ir->op1, rref = ir->op2;
    IROp leftop = (IROp)(IR(lref)->o);
    Reg r64 = REX_64IR(ir, 0);
    int32_t imm = 0;
    lj_assertA(irt_is64(ir->t) || irt_isint(ir->t) ||
	       irt_isu32(ir->t) || irt_isaddr(ir->t) || irt_isu8(ir->t),
	       "bad comparison data type %d", irt_type(ir->t));
    /* Swap constants (only for ABC) and fusable loads to the right. */
    if (irref_isk(lref) || (!irref_isk(rref) && opisfusableload(leftop))) {
      if ((cc & 0xc) == 0xc) cc ^= 0x53;  /* L <-> G, LE <-> GE */
      else if ((cc & 0xa) == 0x2) cc ^= 0x55;  /* A <-> B, AE <-> BE */
      lref = ir->op2; rref = ir->op1;
    }
    if (asm_isk32(as, rref, &imm)) {
      IRIns *irl = IR(lref);
      /* Check wether we can use test ins. Not for unsigned, since CF=0. */
      int usetest = (imm == 0 && (cc & 0xa) != 0x2);
      if (usetest && irl->o == IR_BAND && irl+1 == ir && !ra_used(irl)) {
	/* Combine comp(BAND(ref, r/imm), 0) into test mrm, r/imm. */
	Reg right, left = RID_NONE;
	RegSet allow = RSET_GPR;
	if (!asm_isk32(as, irl->op2, &imm)) {
	  left = ra_alloc1(as, irl->op2, allow);
	  rset_clear(allow, left);
	} else {  /* Try to Fuse IRT_I8/IRT_U8 loads, too. See below. */
	  IRIns *irll = IR(irl->op1);
	  if (opisfusableload((IROp)irll->o) &&
	      (irt_isi8(irll->t) || irt_isu8(irll->t))) {
	    IRType1 origt = irll->t;  /* Temporarily flip types. */
	    irll->t.irt = (irll->t.irt & ~IRT_TYPE) | IRT_INT;
	    as->curins--;  /* Skip to BAND to avoid failing in noconflict(). */
	    right = asm_fuseload(as, irl->op1, RSET_GPR);
	    as->curins++;
	    irll->t = origt;
	    if (right != RID_MRM) goto test_nofuse;
	    /* Fusion succeeded, emit test byte mrm, imm8. */
	    asm_guardcc(as, cc);
	    emit_i8(as, (imm & 0xff));
	    emit_mrm(as, XO_GROUP3b, XOg_TEST, RID_MRM);
	    return;
	  }
	}
	as->curins--;  /* Skip to BAND to avoid failing in noconflict(). */
	right = asm_fuseloadm(as, irl->op1, allow, r64);
	as->curins++;  /* Undo the above. */
      test_nofuse:
	asm_guardcc(as, cc);
	if (ra_noreg(left)) {
	  emit_i32(as, imm);
	  emit_mrm(as, XO_GROUP3, r64 + XOg_TEST, right);
	} else {
	  emit_mrm(as, XO_TEST, r64 + left, right);
	}
      } else {
	Reg left;
	if (opisfusableload((IROp)irl->o) &&
	    ((irt_isu8(irl->t) && checku8(imm)) ||
	     ((irt_isi8(irl->t) || irt_isi16(irl->t)) && checki8(imm)) ||
	     (irt_isu16(irl->t) && checku16(imm) && checki8((int16_t)imm)))) {
	  /* Only the IRT_INT case is fused by asm_fuseload.
	  ** The IRT_I8/IRT_U8 loads and some IRT_I16/IRT_U16 loads
	  ** are handled here.
	  ** Note that cmp word [mem], imm16 should not be generated,
	  ** since it has a length-changing prefix. Compares of a word
	  ** against a sign-extended imm8 are ok, however.
	  */
	  IRType1 origt = irl->t;  /* Temporarily flip types. */
	  irl->t.irt = (irl->t.irt & ~IRT_TYPE) | IRT_INT;
	  left = asm_fuseload(as, lref, RSET_GPR);
	  irl->t = origt;
	  if (left == RID_MRM) {  /* Fusion succeeded? */
	    if (irt_isu8(irl->t) || irt_isu16(irl->t))
	      cc >>= 4;  /* Need unsigned compare. */
	    asm_guardcc(as, cc);
	    emit_i8(as, imm);
	    emit_mrm(as, (irt_isi8(origt) || irt_isu8(origt)) ?
			 XO_ARITHib : XO_ARITHiw8, r64 + XOg_CMP, RID_MRM);
	    return;
	  }  /* Otherwise handle register case as usual. */
	} else {
	  left = asm_fuseloadm(as, lref,
			       irt_isu8(ir->t) ? RSET_GPR8 : RSET_GPR, r64);
	}
	asm_guardcc(as, cc);
	if (usetest && left != RID_MRM) {
	  /* Use test r,r instead of cmp r,0. */
	  x86Op xo = XO_TEST;
	  if (irt_isu8(ir->t)) {
	    lj_assertA(ir->o == IR_EQ || ir->o == IR_NE, "bad usage");
	    xo = XO_TESTb;
	    if (!rset_test(RSET_RANGE(RID_EAX, RID_EBX+1), left)) {
	      if (LJ_64) {
		left |= FORCE_REX;
	      } else {
		emit_i32(as, 0xff);
		emit_mrm(as, XO_GROUP3, XOg_TEST, left);
		return;
	      }
	    }
	  }
	  emit_rr(as, xo, r64 + left, left);
	  if (irl+1 == ir)  /* Referencing previous ins? */
	    as->flagmcp = as->mcp;  /* Set flag to drop test r,r if possible. */
	} else {
	  emit_gmrmi(as, XG_ARITHi(XOg_CMP), r64 + left, imm);
	}
      }
    } else {
      Reg left = ra_alloc1(as, lref, RSET_GPR);
      Reg right = asm_fuseloadm(as, rref, rset_exclude(RSET_GPR, left), r64);
      asm_guardcc(as, cc);
      emit_mrm(as, XO_CMP, r64 + left, right);
    }
  }
}